

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCSweep(Abc_Ntk_t *pNtk,int nCutsMax,int nLeafMax,int fVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  
  pAig = Abc_NtkToDar(pNtk,0,0);
  if (pAig == (Aig_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan = Csw_Sweep(pAig,nCutsMax,nLeafMax,fVerbose);
    pAVar1 = Abc_NtkFromDar(pNtk,pMan);
    Aig_ManStop(pAig);
    Aig_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkCSweep( Abc_Ntk_t * pNtk, int nCutsMax, int nLeafMax, int fVerbose )
{
//    extern Aig_Man_t * Csw_Sweep( Aig_Man_t * pAig, int nCutsMax, int nLeafMax, int fVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    pMan = Csw_Sweep( pTemp = pMan, nCutsMax, nLeafMax, fVerbose );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pTemp );
    Aig_ManStop( pMan );
    return pNtkAig;
}